

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_
          (string *__return_storage_ptr__,QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  QPDFObjectHandle val;
  allocator<char> local_41;
  QPDFObjectHandle local_40;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"/CreationDate",&local_41);
  getParam((QPDFEFStreamObjectHelper *)&local_40,(string *)this);
  std::__cxx11::string::~string(local_30);
  bVar1 = QPDFObjectHandle::isString(&local_40);
  if (bVar1) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(__return_storage_ptr__,&local_40);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFEFStreamObjectHelper::getCreationDate()
{
    auto val = getParam("/CreationDate");
    if (val.isString()) {
        return val.getUTF8Value();
    }
    return "";
}